

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O0

int secp256k1_ec_pubkey_negate(secp256k1_context *ctx,secp256k1_pubkey *pubkey)

{
  undefined1 local_80 [8];
  secp256k1_ge p;
  int ret;
  secp256k1_pubkey *pubkey_local;
  secp256k1_context *ctx_local;
  
  p._84_4_ = 0;
  if (pubkey == (secp256k1_pubkey *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"pubkey != NULL");
    ctx_local._4_4_ = 0;
  }
  else {
    p._84_4_ = secp256k1_pubkey_load(ctx,(secp256k1_ge *)local_80,pubkey);
    memset(pubkey,0,0x40);
    if (p._84_4_ != 0) {
      secp256k1_ge_neg((secp256k1_ge *)local_80,(secp256k1_ge *)local_80);
      secp256k1_pubkey_save(pubkey,(secp256k1_ge *)local_80);
    }
    ctx_local._4_4_ = p._84_4_;
  }
  return ctx_local._4_4_;
}

Assistant:

int secp256k1_ec_pubkey_negate(const secp256k1_context* ctx, secp256k1_pubkey *pubkey) {
    int ret = 0;
    secp256k1_ge p;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(pubkey != NULL);

    ret = secp256k1_pubkey_load(ctx, &p, pubkey);
    memset(pubkey, 0, sizeof(*pubkey));
    if (ret) {
        secp256k1_ge_neg(&p, &p);
        secp256k1_pubkey_save(pubkey, &p);
    }
    return ret;
}